

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

int Llb_ManCutPiNum(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  undefined4 local_28;
  undefined4 local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMinCut_local;
  Aig_Man_t *p_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_PtrSize(vMinCut), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vMinCut,local_24);
    iVar1 = Saig_ObjIsPi(p,pObj_00);
    if (iVar1 != 0) {
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

int Llb_ManCutPiNum( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        if ( Saig_ObjIsPi(p,pObj) )
            Counter++;
    return Counter;
}